

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

int bitset_container_get_index(bitset_container_t *container,uint16_t x)

{
  _Bool _Var1;
  int iVar2;
  ushort in_SI;
  bitset_container_t *in_RDI;
  uint64_t mask;
  uint64_t lastpos;
  uint64_t lastword;
  int end;
  int i;
  int sum;
  int local_1c;
  int local_18;
  int local_4;
  
  _Var1 = bitset_container_get(in_RDI,in_SI);
  if (_Var1) {
    local_18 = 0;
    for (local_1c = 0; local_1c < (int)(in_SI / 0x40); local_1c = local_1c + 1) {
      iVar2 = roaring_hamming(in_RDI->words[local_1c]);
      local_18 = iVar2 + local_18;
    }
    iVar2 = roaring_hamming(in_RDI->words[local_1c] & (1L << (sbyte)((ulong)in_SI % 0x40)) * 2 - 1U)
    ;
    local_4 = iVar2 + local_18 + -1;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int bitset_container_get_index(const bitset_container_t *container, uint16_t x) {
  if (bitset_container_get(container, x)) {
    // credit: aqrit
    int sum = 0;
    int i = 0;
    for (int end = x / 64; i < end; i++){
      sum += roaring_hamming(container->words[i]);
    }
    uint64_t lastword = container->words[i];
    uint64_t lastpos = UINT64_C(1) << (x % 64);
    uint64_t mask = lastpos + lastpos - 1; // smear right
    sum += roaring_hamming(lastword & mask);
    return sum - 1;
  } else {
    return -1;
  }
}